

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImageHandler.cpp
# Opt level: O0

int __thiscall ImageHandler::doTask(ImageHandler *this)

{
  int iVar1;
  element_type *peVar2;
  element_type *peVar3;
  long in_RDI;
  int ret;
  vector<Object,_std::allocator<Object>_> objects;
  vector<Object,_std::allocator<Object>_> *this_00;
  vector<Object,_std::allocator<Object>_> local_28;
  int local_4;
  
  this_00 = &local_28;
  std::vector<Object,_std::allocator<Object>_>::vector
            ((vector<Object,_std::allocator<Object>_> *)0x14d142);
  peVar2 = std::__shared_ptr_access<Detector,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Detector,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      0x14d150);
  iVar1 = (*peVar2->_vptr_Detector[2])(peVar2,in_RDI + 0x38,this_00,in_RDI + 0x98);
  if (iVar1 == 0) {
    peVar3 = std::__shared_ptr_access<Effect,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Effect,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        0x14d1c3);
    iVar1 = (*peVar3->_vptr_Effect[2])(peVar3,in_RDI + 0x38,&local_28);
    if (iVar1 == 0) {
      local_4 = 0;
    }
    else {
      local_4 = -1;
    }
  }
  else {
    local_4 = -1;
  }
  std::vector<Object,_std::allocator<Object>_>::~vector(this_00);
  return local_4;
}

Assistant:

int ImageHandler::doTask() 
{
    std::vector<Object> objects;

    int ret = m_detector->detect(m_img, objects, m_targetName);
    if (ret != 0) 
    {
        return -1;
    }
    //ret = m_detector->draw(m_img, objects);

    ret = m_effect->draw(m_img, objects);
    if (ret != 0) 
    {
        return -1;
    }

    return 0;
}